

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# batchnorm_x86_fma.cpp
# Opt level: O1

int __thiscall
ncnn::BatchNorm_x86_fma::forward_inplace(BatchNorm_x86_fma *this,Mat *bottom_top_blob,Option *opt)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  _func_int **pp_Var5;
  long lVar6;
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  uint uVar9;
  undefined1 (*pauVar10) [32];
  int iVar11;
  uint uVar12;
  int iVar13;
  uint uVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  uint uVar18;
  undefined1 (*pauVar19) [32];
  uint uVar20;
  undefined1 (*pauVar21) [32];
  uint uVar22;
  ulong uVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 in_ZMM3 [64];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  
  auVar8 = _DAT_00588720;
  auVar7 = _DAT_00588700;
  auVar26 = in_ZMM3._0_16_;
  iVar1 = bottom_top_blob->elempack;
  iVar11 = bottom_top_blob->dims;
  iVar2 = bottom_top_blob->w;
  uVar9 = bottom_top_blob->h;
  iVar3 = bottom_top_blob->d;
  uVar4 = bottom_top_blob->c;
  if (iVar11 == 2) {
    if (0 < (int)uVar9) {
      uVar18 = iVar1 * iVar2;
      pp_Var5 = this->_vptr_BatchNorm_x86_fma;
      uVar23 = 0;
      auVar24._8_8_ = 0x8000000000000000;
      auVar24._0_8_ = 0x8000000000000000;
      auVar26 = vpcmpeqd_avx(auVar26,auVar26);
      do {
        lVar15 = *(long *)(&this->field_0x1f8 + (long)pp_Var5[-3]);
        uVar22 = *(uint *)(lVar15 + uVar23 * 4);
        if (iVar1 == 4) {
          auVar31 = *(undefined1 (*) [16])(lVar15 + uVar23 * 0x10);
        }
        else {
          auVar31 = vshufps_avx(ZEXT416(uVar22),ZEXT416(uVar22),0);
        }
        lVar6 = *(long *)(&this->field_0x240 + (long)pp_Var5[-3]);
        uVar14 = *(uint *)(lVar6 + uVar23 * 4);
        if (iVar1 == 4) {
          auVar25 = *(undefined1 (*) [16])(lVar6 + uVar23 * 0x10);
        }
        else {
          auVar25 = vshufps_avx(ZEXT416(uVar14),ZEXT416(uVar14),0);
        }
        if (iVar1 == 8) {
          auVar33 = *(undefined1 (*) [32])(lVar15 + uVar23 * 0x20);
          auVar39 = *(undefined1 (*) [32])(lVar6 + uVar23 * 0x20);
        }
        else {
          auVar33._16_16_ = auVar31;
          auVar33._0_16_ = auVar31;
          auVar39._16_16_ = auVar25;
          auVar39._0_16_ = auVar25;
        }
        pauVar19 = (undefined1 (*) [32])
                   ((long)bottom_top_blob->w * uVar23 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        uVar12 = 0;
        if (7 < (int)uVar18) {
          iVar13 = 7;
          do {
            auVar32 = vfmadd132ps_fma(*pauVar19,auVar33,auVar39);
            *pauVar19 = ZEXT1632(auVar32);
            pauVar19 = pauVar19 + 1;
            iVar13 = iVar13 + 8;
            uVar12 = uVar18 & 0xfffffff8;
          } while (iVar13 < (int)uVar18);
        }
        uVar20 = uVar12 | 3;
        while ((int)uVar20 < (int)uVar18) {
          auVar32 = vfmadd132ps_fma(*(undefined1 (*) [16])*pauVar19,auVar31,auVar25);
          *(undefined1 (*) [16])*pauVar19 = auVar32;
          pauVar19 = (undefined1 (*) [32])(*pauVar19 + 0x10);
          uVar20 = uVar12 + 7;
          uVar12 = uVar12 + 4;
        }
        if ((int)uVar12 < (int)uVar18) {
          uVar16 = CONCAT44(0,~uVar12 + uVar18);
          auVar31._8_8_ = 0;
          auVar31._0_8_ = uVar16;
          auVar32 = vpshufd_avx(auVar31,0x44);
          auVar31 = vshufps_avx(ZEXT416(uVar14),ZEXT416(uVar14),0);
          auVar29._16_16_ = auVar31;
          auVar29._0_16_ = auVar31;
          auVar31 = vshufps_avx(ZEXT416(uVar22),ZEXT416(uVar22),0);
          auVar27._16_16_ = auVar31;
          auVar27._0_16_ = auVar31;
          auVar31 = vorps_avx(auVar32,auVar24);
          auVar25 = vorps_avx(auVar32,auVar24);
          uVar17 = 0;
          do {
            auVar35._8_8_ = 0;
            auVar35._0_8_ = uVar17;
            auVar35 = vpshufd_avx(auVar35,0x44);
            auVar40._16_16_ = auVar35;
            auVar40._0_16_ = auVar35;
            auVar33 = vorps_avx(auVar40,auVar7);
            auVar39 = vorps_avx(auVar40,auVar8);
            auVar35 = vorps_avx(auVar32,auVar24);
            auVar47._0_8_ = auVar39._16_8_ ^ 0x8000000000000000;
            auVar47._8_4_ = auVar39._24_4_;
            auVar47._12_4_ = auVar39._28_4_ ^ 0x80000000;
            auVar47 = vpcmpgtq_avx(auVar47,auVar35);
            auVar36._0_8_ = auVar39._0_8_ ^ 0x8000000000000000;
            auVar36._8_4_ = auVar39._8_4_;
            auVar36._12_4_ = auVar39._12_4_ ^ 0x80000000;
            auVar36 = vpcmpgtq_avx(auVar36,auVar31);
            auVar47 = vpackssdw_avx(auVar36,auVar47);
            auVar48._0_8_ = auVar33._16_8_ ^ 0x8000000000000000;
            auVar48._8_4_ = auVar33._24_4_;
            auVar48._12_4_ = auVar33._28_4_ ^ 0x80000000;
            auVar35 = vpcmpgtq_avx(auVar48,auVar35);
            auVar45._0_8_ = auVar33._0_8_ ^ 0x8000000000000000;
            auVar45._8_4_ = auVar33._8_4_;
            auVar45._12_4_ = auVar33._12_4_ ^ 0x80000000;
            auVar36 = vpcmpgtq_avx(auVar45,auVar25);
            auVar35 = vpackssdw_avx(auVar36,auVar35);
            auVar35 = vpackssdw_avx(auVar35 ^ auVar26,auVar47 ^ auVar26);
            auVar47 = vpmovsxwd_avx(auVar35);
            auVar35 = vpunpckhwd_avx(auVar35,auVar35);
            auVar41._16_16_ = auVar35;
            auVar41._0_16_ = auVar47;
            auVar33 = vmaskmovps_avx(auVar41,*(undefined1 (*) [32])(*pauVar19 + uVar17 * 4));
            auVar35 = vfmadd213ps_fma(auVar33,auVar29,auVar27);
            auVar33 = vmaskmovps_avx(auVar41,ZEXT1632(auVar35));
            *(undefined1 (*) [32])(*pauVar19 + uVar17 * 4) = auVar33;
            uVar17 = uVar17 + 8;
          } while ((uVar16 + 8 & 0x1fffffff8) != uVar17);
        }
        uVar23 = uVar23 + 1;
      } while (uVar23 != uVar9);
    }
  }
  else if (iVar11 == 1) {
    pauVar19 = (undefined1 (*) [32])bottom_top_blob->data;
    pauVar10 = *(undefined1 (**) [32])(&this->field_0x1f8 + (long)this->_vptr_BatchNorm_x86_fma[-3])
    ;
    pauVar21 = *(undefined1 (**) [32])(&this->field_0x240 + (long)this->_vptr_BatchNorm_x86_fma[-3])
    ;
    uVar22 = iVar1 * iVar2;
    uVar18 = 0;
    if (7 < (int)uVar22) {
      uVar18 = uVar22 & 0x7ffffff8;
      iVar13 = 7;
      do {
        auVar24 = vfmadd213ps_fma(*pauVar21,*pauVar19,*pauVar10);
        *pauVar19 = ZEXT1632(auVar24);
        pauVar19 = pauVar19 + 1;
        pauVar10 = pauVar10 + 1;
        pauVar21 = pauVar21 + 1;
        iVar13 = iVar13 + 8;
      } while (iVar13 < (int)uVar22);
    }
    uVar14 = uVar18 | 3;
    while ((int)uVar14 < (int)uVar22) {
      auVar24 = vfmadd213ps_fma(*(undefined1 (*) [16])*pauVar21,*(undefined1 (*) [16])*pauVar19,
                                *(undefined1 (*) [16])*pauVar10);
      *(undefined1 (*) [16])*pauVar19 = auVar24;
      pauVar19 = (undefined1 (*) [32])(*pauVar19 + 0x10);
      pauVar10 = (undefined1 (*) [32])(*pauVar10 + 0x10);
      pauVar21 = (undefined1 (*) [32])(*pauVar21 + 0x10);
      uVar14 = uVar18 + 7;
      uVar18 = uVar18 + 4;
    }
    if (uVar22 - uVar18 != 0 && (int)uVar18 <= (int)uVar22) {
      lVar15 = 0;
      do {
        auVar24 = vfmadd213ss_fma(ZEXT416(*(uint *)(*pauVar19 + lVar15 * 4)),
                                  ZEXT416(*(uint *)(*pauVar21 + lVar15 * 4)),
                                  ZEXT416(*(uint *)(*pauVar10 + lVar15 * 4)));
        *(int *)(*pauVar19 + lVar15 * 4) = auVar24._0_4_;
        lVar15 = lVar15 + 1;
      } while (uVar22 - uVar18 != (int)lVar15);
    }
  }
  auVar8 = _DAT_00588720;
  auVar7 = _DAT_00588700;
  if ((iVar11 - 3U < 2) && (0 < (int)uVar4)) {
    uVar9 = iVar2 * iVar1 * uVar9 * iVar3;
    pp_Var5 = this->_vptr_BatchNorm_x86_fma;
    uVar23 = 0;
    auVar25._8_8_ = 0x8000000000000000;
    auVar25._0_8_ = 0x8000000000000000;
    auVar26 = vpcmpeqd_avx(auVar26,auVar26);
    do {
      lVar15 = *(long *)(&this->field_0x1f8 + (long)pp_Var5[-3]);
      uVar18 = *(uint *)(lVar15 + uVar23 * 4);
      if (iVar1 == 4) {
        auVar24 = *(undefined1 (*) [16])(lVar15 + uVar23 * 0x10);
      }
      else {
        auVar24 = vshufps_avx(ZEXT416(uVar18),ZEXT416(uVar18),0);
      }
      lVar6 = *(long *)(&this->field_0x240 + (long)pp_Var5[-3]);
      uVar22 = *(uint *)(lVar6 + uVar23 * 4);
      if (iVar1 == 4) {
        auVar31 = *(undefined1 (*) [16])(lVar6 + uVar23 * 0x10);
      }
      else {
        auVar31 = vshufps_avx(ZEXT416(uVar22),ZEXT416(uVar22),0);
      }
      if (iVar1 == 8) {
        auVar34 = *(undefined1 (*) [32])(lVar15 + uVar23 * 0x20);
        auVar42 = *(undefined1 (*) [32])(lVar6 + uVar23 * 0x20);
      }
      else {
        auVar34._16_16_ = auVar24;
        auVar34._0_16_ = auVar24;
        auVar42._16_16_ = auVar31;
        auVar42._0_16_ = auVar31;
      }
      pauVar19 = (undefined1 (*) [32])
                 (bottom_top_blob->cstep * uVar23 * bottom_top_blob->elemsize +
                 (long)bottom_top_blob->data);
      uVar14 = 0;
      if (7 < (int)uVar9) {
        iVar11 = 7;
        do {
          auVar32 = vfmadd132ps_fma(*pauVar19,auVar34,auVar42);
          *pauVar19 = ZEXT1632(auVar32);
          pauVar19 = pauVar19 + 1;
          iVar11 = iVar11 + 8;
          uVar14 = uVar9 & 0xfffffff8;
        } while (iVar11 < (int)uVar9);
      }
      uVar12 = uVar14 | 3;
      while ((int)uVar12 < (int)uVar9) {
        auVar32 = vfmadd132ps_fma(*(undefined1 (*) [16])*pauVar19,auVar24,auVar31);
        *(undefined1 (*) [16])*pauVar19 = auVar32;
        pauVar19 = (undefined1 (*) [32])(*pauVar19 + 0x10);
        uVar12 = uVar14 + 7;
        uVar14 = uVar14 + 4;
      }
      if ((int)uVar14 < (int)uVar9) {
        uVar16 = CONCAT44(0,~uVar14 + uVar9);
        auVar32._8_8_ = 0;
        auVar32._0_8_ = uVar16;
        auVar32 = vpshufd_avx(auVar32,0x44);
        auVar24 = vshufps_avx(ZEXT416(uVar22),ZEXT416(uVar22),0);
        auVar30._16_16_ = auVar24;
        auVar30._0_16_ = auVar24;
        auVar24 = vshufps_avx(ZEXT416(uVar18),ZEXT416(uVar18),0);
        auVar28._16_16_ = auVar24;
        auVar28._0_16_ = auVar24;
        auVar24 = vorps_avx(auVar32,auVar25);
        auVar31 = vorps_avx(auVar32,auVar25);
        uVar17 = 0;
        do {
          auVar37._8_8_ = 0;
          auVar37._0_8_ = uVar17;
          auVar35 = vpshufd_avx(auVar37,0x44);
          auVar43._16_16_ = auVar35;
          auVar43._0_16_ = auVar35;
          auVar33 = vorps_avx(auVar43,auVar7);
          auVar39 = vorps_avx(auVar43,auVar8);
          auVar35 = vorps_avx(auVar32,auVar25);
          auVar49._0_8_ = auVar39._16_8_ ^ 0x8000000000000000;
          auVar49._8_4_ = auVar39._24_4_;
          auVar49._12_4_ = auVar39._28_4_ ^ 0x80000000;
          auVar47 = vpcmpgtq_avx(auVar49,auVar35);
          auVar38._0_8_ = auVar39._0_8_ ^ 0x8000000000000000;
          auVar38._8_4_ = auVar39._8_4_;
          auVar38._12_4_ = auVar39._12_4_ ^ 0x80000000;
          auVar36 = vpcmpgtq_avx(auVar38,auVar24);
          auVar47 = vpackssdw_avx(auVar36,auVar47);
          auVar50._0_8_ = auVar33._16_8_ ^ 0x8000000000000000;
          auVar50._8_4_ = auVar33._24_4_;
          auVar50._12_4_ = auVar33._28_4_ ^ 0x80000000;
          auVar35 = vpcmpgtq_avx(auVar50,auVar35);
          auVar46._0_8_ = auVar33._0_8_ ^ 0x8000000000000000;
          auVar46._8_4_ = auVar33._8_4_;
          auVar46._12_4_ = auVar33._12_4_ ^ 0x80000000;
          auVar36 = vpcmpgtq_avx(auVar46,auVar31);
          auVar35 = vpackssdw_avx(auVar36,auVar35);
          auVar35 = vpackssdw_avx(auVar35 ^ auVar26,auVar47 ^ auVar26);
          auVar47 = vpmovsxwd_avx(auVar35);
          auVar35 = vpunpckhwd_avx(auVar35,auVar35);
          auVar44._16_16_ = auVar35;
          auVar44._0_16_ = auVar47;
          auVar33 = vmaskmovps_avx(auVar44,*(undefined1 (*) [32])(*pauVar19 + uVar17 * 4));
          auVar35 = vfmadd213ps_fma(auVar33,auVar30,auVar28);
          auVar33 = vmaskmovps_avx(auVar44,ZEXT1632(auVar35));
          *(undefined1 (*) [32])(*pauVar19 + uVar17 * 4) = auVar33;
          uVar17 = uVar17 + 8;
        } while ((uVar16 + 8 & 0x1fffffff8) != uVar17);
      }
      uVar23 = uVar23 + 1;
    } while (uVar23 != uVar4);
  }
  return 0;
}

Assistant:

int BatchNorm_x86_fma::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int dims = bottom_top_blob.dims;
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int c = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;

    if (dims == 1)
    {
        float* ptr = bottom_top_blob;
        const float* aptr = a_data;
        const float* bptr = b_data;

        const int size = w * elempack;

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p512 = _mm512_loadu_ps(ptr);
            __m512 _a512 = _mm512_loadu_ps(aptr);
            __m512 _b512 = _mm512_loadu_ps(bptr);
            _p512 = _mm512_fmadd_ps(_p512, _b512, _a512);
            _mm512_storeu_ps(ptr, _p512);
            ptr += 16;
            aptr += 16;
            bptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p256 = _mm256_loadu_ps(ptr);
            __m256 _a256 = _mm256_loadu_ps(aptr);
            __m256 _b256 = _mm256_loadu_ps(bptr);
            _p256 = _mm256_comp_fmadd_ps(_p256, _b256, _a256);
            _mm256_storeu_ps(ptr, _p256);
            ptr += 8;
            aptr += 8;
            bptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p128 = _mm_loadu_ps(ptr);
            __m128 _a128 = _mm_loadu_ps(aptr);
            __m128 _b128 = _mm_loadu_ps(bptr);
            _p128 = _mm_comp_fmadd_ps(_p128, _b128, _a128);
            _mm_storeu_ps(ptr, _p128);
            ptr += 4;
            aptr += 4;
            bptr += 4;
        }
#endif // __SSE__
        for (; i < size; i++)
        {
            *ptr = *bptr * *ptr + *aptr;
            ptr++;
            aptr++;
            bptr++;
        }
    }

    if (dims == 2)
    {
        const int size = w * elempack;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < h; i++)
        {
            float* ptr = bottom_top_blob.row(i);
            float a = a_data[i];
            float b = b_data[i];

#if __SSE2__
            __m128 _a128 = (elempack == 4) ? _mm_loadu_ps((const float*)a_data + i * 4) : _mm_set1_ps(a);
            __m128 _b128 = (elempack == 4) ? _mm_loadu_ps((const float*)b_data + i * 4) : _mm_set1_ps(b);
#if __AVX__
            __m256 _a256 = (elempack == 8) ? _mm256_loadu_ps((const float*)a_data + i * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_a128), _a128, 1);
            __m256 _b256 = (elempack == 8) ? _mm256_loadu_ps((const float*)b_data + i * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_b128), _b128, 1);
#if __AVX512F__
            __m512 _a512 = (elempack == 16) ? _mm512_loadu_ps((const float*)a_data + i * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_a256), _a256, 1);
            __m512 _b512 = (elempack == 16) ? _mm512_loadu_ps((const float*)b_data + i * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_b256), _b256, 1);
#endif // __AVX512F__
#endif // __AVX__
#endif // __SSE2__

            int j = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            for (; j + 15 < size; j += 16)
            {
                __m512 _p512 = _mm512_loadu_ps(ptr);
                _p512 = _mm512_fmadd_ps(_p512, _b512, _a512);
                _mm512_storeu_ps(ptr, _p512);
                ptr += 16;
            }
#endif // __AVX512F__
            for (; j + 7 < size; j += 8)
            {
                __m256 _p256 = _mm256_loadu_ps(ptr);
                _p256 = _mm256_comp_fmadd_ps(_p256, _b256, _a256);
                _mm256_storeu_ps(ptr, _p256);
                ptr += 8;
            }
#endif // __AVX__
            for (; j + 3 < size; j += 4)
            {
                __m128 _p128 = _mm_loadu_ps(ptr);
                _p128 = _mm_comp_fmadd_ps(_p128, _b128, _a128);
                _mm_storeu_ps(ptr, _p128);
                ptr += 4;
            }
#endif // __SSE__
            for (; j < size; j++)
            {
                *ptr = b * *ptr + a;
                ptr++;
            }
        }
    }

    if (dims == 3 || dims == 4)
    {
        const int size = w * h * d * elempack;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < c; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            float a = a_data[q];
            float b = b_data[q];

#if __SSE2__
            __m128 _a128 = (elempack == 4) ? _mm_loadu_ps((const float*)a_data + q * 4) : _mm_set1_ps(a);
            __m128 _b128 = (elempack == 4) ? _mm_loadu_ps((const float*)b_data + q * 4) : _mm_set1_ps(b);
#if __AVX__
            __m256 _a256 = (elempack == 8) ? _mm256_loadu_ps((const float*)a_data + q * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_a128), _a128, 1);
            __m256 _b256 = (elempack == 8) ? _mm256_loadu_ps((const float*)b_data + q * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_b128), _b128, 1);
#if __AVX512F__
            __m512 _a512 = (elempack == 16) ? _mm512_loadu_ps((const float*)a_data + q * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_a256), _a256, 1);
            __m512 _b512 = (elempack == 16) ? _mm512_loadu_ps((const float*)b_data + q * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_b256), _b256, 1);
#endif // __AVX512F__
#endif // __AVX__
#endif // __SSE2__

            int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            for (; i + 15 < size; i += 16)
            {
                __m512 _p512 = _mm512_loadu_ps(ptr);
                _p512 = _mm512_fmadd_ps(_p512, _b512, _a512);
                _mm512_storeu_ps(ptr, _p512);
                ptr += 16;
            }
#endif // __AVX512F__
            for (; i + 7 < size; i += 8)
            {
                __m256 _p256 = _mm256_loadu_ps(ptr);
                _p256 = _mm256_comp_fmadd_ps(_p256, _b256, _a256);
                _mm256_storeu_ps(ptr, _p256);
                ptr += 8;
            }
#endif // __AVX__
            for (; i + 3 < size; i += 4)
            {
                __m128 _p128 = _mm_loadu_ps(ptr);
                _p128 = _mm_comp_fmadd_ps(_p128, _b128, _a128);
                _mm_storeu_ps(ptr, _p128);
                ptr += 4;
            }
#endif // __SSE__
            for (; i < size; i++)
            {
                *ptr = b * *ptr + a;
                ptr++;
            }
        }
    }

    return 0;
}